

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O1

void __thiscall NaTransFunc::Clean(NaTransFunc *this)

{
  if (this->ut < utPolyFrac) {
    NaDynAr<NaTransFunc_*>::clean(&this->items);
  }
  else if (this->ut != utPolyFrac) goto LAB_001519ff;
  NaVector::new_dim(&(this->pf).num,0);
  NaVector::new_dim(&(this->pf).den,0);
LAB_001519ff:
  this->ut = utPolyFrac;
  return;
}

Assistant:

void
NaTransFunc::Clean ()
{
    switch(ut){
    case utSum:
    case utProduct:
        items.clean();
        // no break;
    case utPolyFrac:
        pf.num.new_dim(0);
        pf.den.new_dim(0);
        break;
    }
    ut = utPolyFrac;
}